

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_insert.c
# Opt level: O3

int mpt_gnode_insert(mpt_node *parent,int pos,mpt_node *node)

{
  int iVar1;
  int *piVar2;
  
  if (node == (mpt_node *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    iVar1 = -1;
  }
  else {
    if (parent->children == (mpt_node *)0x0) {
      parent->children = node;
      node->parent = parent;
    }
    else {
      node_insert(parent->children,pos,node,mpt_gnode_pos);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

extern int mpt_gnode_insert(MPT_STRUCT(node) *parent, int pos, MPT_STRUCT(node) *node)
{
	if (!node) {
		errno = EFAULT;
		return -1;
	}
	if (!parent->children) {
		parent->children = node;
		node->parent = parent;
		return 0;
	}
	node_insert(parent->children, pos, node, (MPT_STRUCT(node) *(*)()) mpt_gnode_pos);
	
	return 0;
}